

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O0

bool CheckSignetBlockSolution(CBlock *block,Params *consensusParams)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  initializer_list<CTxOut> __l;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  undefined1 uVar2;
  SignetTxs *pSVar3;
  long in_FS_OFFSET;
  CScriptWitness *witness;
  CScript *scriptSig;
  TransactionSignatureChecker sigcheck;
  PrecomputedTransactionData txdata;
  optional<SignetTxs> signet_txs;
  CScript challenge;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  base_blob<256U> *in_stack_fffffffffffffb90;
  PrecomputedTransactionData *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  undefined4 in_stack_fffffffffffffba8;
  uint in_stack_fffffffffffffbac;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  GenericTransactionSignatureChecker<CTransaction> *in_stack_fffffffffffffbb8;
  CTransaction *in_stack_fffffffffffffbc0;
  PrecomputedTransactionData *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  size_type in_stack_fffffffffffffbd8;
  LogFlags in_stack_fffffffffffffbf0;
  undefined1 *flag;
  undefined8 in_stack_fffffffffffffbf8;
  int iVar4;
  BaseSignatureChecker *local_3e8;
  CTransaction *serror;
  ConstevalFormatString<0U> in_stack_fffffffffffffc38;
  ConstevalFormatString<0U> fmt;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined1 *puVar5;
  CScript *in_stack_fffffffffffffc48;
  CScriptWitness *witness_00;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  CScript *scriptSig_00;
  bool local_329;
  Level in_stack_fffffffffffffd30;
  BaseSignatureChecker local_2a0 [5];
  BaseSignatureChecker local_278 [37];
  undefined1 local_150 [264];
  CScript local_48 [2];
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash
            ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  bVar1 = operator==((base_blob<256U> *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  if (bVar1) {
    local_329 = true;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb90);
    scriptSig_00 = local_48;
    first._M_current._4_4_ = in_stack_fffffffffffffbac;
    first._M_current._0_4_ = in_stack_fffffffffffffba8;
    last._M_current._7_1_ = in_stack_fffffffffffffba7;
    last._M_current._0_7_ = in_stack_fffffffffffffba0;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),first,last);
    SignetTxs::Create((CBlock *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                      in_stack_fffffffffffffc48);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<SignetTxs> *)
                       CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar1) {
      puVar5 = local_150;
      std::optional<SignetTxs>::operator->
                ((optional<SignetTxs> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      witness_00 = (CScriptWitness *)0x0;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffb98,
                 (size_type)in_stack_fffffffffffffb90);
      std::optional<SignetTxs>::operator->
                ((optional<SignetTxs> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffb98,
                 (size_type)in_stack_fffffffffffffb90);
      PrecomputedTransactionData::PrecomputedTransactionData
                ((PrecomputedTransactionData *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      pSVar3 = std::optional<SignetTxs>::operator->
                         ((optional<SignetTxs> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      serror = &pSVar3->m_to_sign;
      fmt.fmt = (char *)local_2a0;
      std::optional<SignetTxs>::operator->
                ((optional<SignetTxs> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb98,
                 (size_type)in_stack_fffffffffffffb90);
      CTxOut::CTxOut((CTxOut *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                     (CTxOut *)0x73dbe6);
      std::allocator<CTxOut>::allocator
                ((allocator<CTxOut> *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88))
      ;
      __l._M_array._7_1_ = in_stack_fffffffffffffbd7;
      __l._M_array._0_7_ = in_stack_fffffffffffffbd0;
      __l._M_len = in_stack_fffffffffffffbd8;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffbc8,__l,
                 (allocator_type *)in_stack_fffffffffffffbc0);
      PrecomputedTransactionData::Init<CTransaction>
                (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                 (vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffbb8,
                 (bool)in_stack_fffffffffffffbb7);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb98);
      std::allocator<CTxOut>::~allocator
                ((allocator<CTxOut> *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88))
      ;
      local_3e8 = local_278;
      do {
        local_3e8 = local_3e8 + -5;
        CTxOut::~CTxOut((CTxOut *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      } while (local_3e8 != local_2a0);
      flag = local_150;
      pSVar3 = std::optional<SignetTxs>::operator->
                         ((optional<SignetTxs> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      iVar4 = (int)((ulong)&pSVar3->m_to_sign >> 0x20);
      std::optional<SignetTxs>::operator->
                ((optional<SignetTxs> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb98,
                 (size_type)in_stack_fffffffffffffb90);
      GenericTransactionSignatureChecker<CTransaction>::GenericTransactionSignatureChecker
                (in_stack_fffffffffffffbb8,
                 (CTransaction *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffbac,
                 (CAmount *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                 in_stack_fffffffffffffb98,
                 (MissingDataBehavior)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      std::optional<SignetTxs>::operator->
                ((optional<SignetTxs> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb98,
                 (size_type)in_stack_fffffffffffffb90);
      bVar1 = VerifyScript(scriptSig_00,
                           (CScript *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                           witness_00,(uint)((ulong)puVar5 >> 0x20),(BaseSignatureChecker *)fmt.fmt,
                           (ScriptError *)serror);
      if (bVar1) {
        local_329 = true;
      }
      else {
        bVar1 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                                  Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                     (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
          in_stack_fffffffffffffb88 = 1;
          logging_function_00._M_len._7_1_ = in_stack_fffffffffffffc57;
          logging_function_00._M_len._0_7_ = in_stack_fffffffffffffc50;
          logging_function_00._M_str = (char *)scriptSig_00;
          source_file_00._M_str = (char *)witness_00;
          source_file_00._M_len = (size_t)puVar5;
          LogPrintFormatInternal<>
                    (logging_function_00,source_file_00,iVar4,(LogFlags)flag,
                     in_stack_fffffffffffffd30,fmt);
        }
        local_329 = false;
      }
      PrecomputedTransactionData::~PrecomputedTransactionData
                ((PrecomputedTransactionData *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
    else {
      uVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),Trace)
      ;
      if ((bool)uVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
        in_stack_fffffffffffffb88 = 1;
        logging_function._M_len._7_1_ = uVar2;
        logging_function._M_len._0_7_ = in_stack_fffffffffffffc50;
        logging_function._M_str = (char *)scriptSig_00;
        source_file._M_len._4_4_ = in_stack_fffffffffffffc44;
        source_file._M_len._0_4_ = in_stack_fffffffffffffc40;
        source_file._M_str = (char *)in_stack_fffffffffffffc48;
        LogPrintFormatInternal<>
                  (logging_function,source_file,iVar4,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffd30,in_stack_fffffffffffffc38);
      }
      local_329 = false;
    }
    std::optional<SignetTxs>::~optional
              ((optional<SignetTxs> *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88))
    ;
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_329;
}

Assistant:

bool CheckSignetBlockSolution(const CBlock& block, const Consensus::Params& consensusParams)
{
    if (block.GetHash() == consensusParams.hashGenesisBlock) {
        // genesis block solution is always valid
        return true;
    }

    const CScript challenge(consensusParams.signet_challenge.begin(), consensusParams.signet_challenge.end());
    const std::optional<SignetTxs> signet_txs = SignetTxs::Create(block, challenge);

    if (!signet_txs) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution parse failure)\n");
        return false;
    }

    const CScript& scriptSig = signet_txs->m_to_sign.vin[0].scriptSig;
    const CScriptWitness& witness = signet_txs->m_to_sign.vin[0].scriptWitness;

    PrecomputedTransactionData txdata;
    txdata.Init(signet_txs->m_to_sign, {signet_txs->m_to_spend.vout[0]});
    TransactionSignatureChecker sigcheck(&signet_txs->m_to_sign, /* nInIn= */ 0, /* amountIn= */ signet_txs->m_to_spend.vout[0].nValue, txdata, MissingDataBehavior::ASSERT_FAIL);

    if (!VerifyScript(scriptSig, signet_txs->m_to_spend.vout[0].scriptPubKey, &witness, BLOCK_SCRIPT_VERIFY_FLAGS, sigcheck)) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution invalid)\n");
        return false;
    }
    return true;
}